

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

int replay_display_objects(nh_objitem *items,int icount,char *title,int how,nh_objresult *pick_list)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  int id;
  int local_38;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  lVar5 = 0;
  if (1 < how + 1U) {
    pcVar2 = next_log_token();
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'o')) {
      parse_error("Bad object menu data");
    }
    lVar5 = 0xffffffff;
    if (pcVar2[2] != 'x') {
      pcVar2 = pcVar2 + 3;
      _local_38 = CONCAT44(local_34,0xffffffff);
      lVar5 = 0;
      iVar1 = __isoc99_sscanf(pcVar2,"%x,%x:",&local_34);
      if (iVar1 != 0) {
        lVar5 = 0;
        do {
          if (icount < 1) {
LAB_001b9fe2:
            parse_error("Invalid menu id in object menu data");
          }
          lVar3 = 1;
          piVar4 = &items->id;
          do {
            iVar1 = *piVar4;
            if (icount <= lVar3) break;
            piVar4 = piVar4 + 0x49;
            lVar3 = lVar3 + 1;
          } while (iVar1 != local_34);
          if (iVar1 != local_34) goto LAB_001b9fe2;
          pick_list[lVar5].id = local_34;
          pick_list[lVar5].count = local_38;
          lVar5 = lVar5 + 1;
          pcVar2 = strchr(pcVar2,0x3a);
          pcVar2 = pcVar2 + 1;
          _local_38 = CONCAT44(local_34,0xffffffff);
          iVar1 = __isoc99_sscanf(pcVar2,"%x,%x:",&local_34,&local_38);
        } while (iVar1 != 0);
      }
    }
  }
  return (int)lVar5;
}

Assistant:

static int replay_display_objects(struct nh_objitem *items, int icount, const char *title,
			int how, struct nh_objresult *pick_list)
{
    int i, j, id, count;
    char *token;
    char *resultbuf;
    boolean id_ok;
    
    if (how == PICK_NONE || how == PICK_INVACTION)
	return 0;
    
    token = next_log_token();
    if (!token || token[0] != 'o')
	parse_error("Bad object menu data");
    resultbuf = token + 2;
    
    if (*resultbuf++ == 'x')
	return -1;
    
    i = 0;
    count = -1;
    while (sscanf(resultbuf, "%x,%x:", &id, &count)) {
	/* make sure all ids are valid - program changes could have broken the save */
	id_ok  = FALSE;
	for (j = 0; j < icount && !id_ok; j++)
	    if (items[j].id == id)
		id_ok = TRUE;
	if (!id_ok)
	    parse_error("Invalid menu id in object menu data");
	
	pick_list[i].id = id;
	pick_list[i].count = count;
	i++;
	resultbuf = strchr(resultbuf, ':') + 1;
	count = -1;
    }

    return i;
}